

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

void __thiscall
pbrt::HaltonSampler::StartPixelSample(HaltonSampler *this,Point2i *p,int sampleIndex,int dim)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Point2i *pPVar13;
  long lVar14;
  
  uVar11 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>.y *
           (this->baseScales).super_Tuple2<pbrt::Point2,_int>.x;
  if ((int)uVar11 < 2) {
    lVar10 = 0;
  }
  else {
    iVar7 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.x;
    iVar3 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>.y;
    piVar1 = &(this->baseScales).super_Tuple2<pbrt::Point2,_int>.y;
    lVar9 = 0;
    lVar10 = 0;
    bVar5 = true;
    do {
      bVar4 = bVar5;
      if (bVar4) {
        pPVar13 = &this->baseScales;
        if (iVar7 < 1) {
LAB_0026860d:
          lVar14 = 0;
        }
        else {
          lVar14 = 0;
          uVar8 = (ulong)((p->super_Tuple2<pbrt::Point2,_int>).x & 0x7f);
          iVar6 = iVar7;
          do {
            uVar12 = (uint)uVar8;
            uVar8 = uVar8 >> 1;
            iVar6 = iVar6 + -1;
            lVar14 = (ulong)(uVar12 & 1) + lVar14 * 2;
          } while (iVar6 != 0);
        }
      }
      else {
        pPVar13 = (Point2i *)piVar1;
        if (iVar3 < 1) goto LAB_0026860d;
        lVar14 = 0;
        uVar8 = (ulong)((p->super_Tuple2<pbrt::Point2,_int>).y & 0x7f);
        iVar6 = iVar3;
        do {
          lVar14 = lVar14 * 3 + uVar8 % 3;
          iVar6 = iVar6 + -1;
          uVar8 = uVar8 / 3;
        } while (iVar6 != 0);
      }
      piVar2 = this->multInverse + lVar9;
      lVar9 = 1;
      lVar10 = lVar10 + *piVar2 * lVar14 *
                        (long)((int)uVar11 / (pPVar13->super_Tuple2<pbrt::Point2,_int>).x);
      bVar5 = false;
    } while (bVar4);
    lVar10 = lVar10 % (long)(ulong)uVar11;
  }
  iVar7 = 2;
  if (2 < dim) {
    iVar7 = dim;
  }
  this->haltonIndex = (int)(uVar11 * sampleIndex) + lVar10;
  this->dimension = iVar7;
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int sampleIndex, int dim) {
        haltonIndex = 0;
        int sampleStride = baseScales[0] * baseScales[1];
        // Compute Halton sample offset for first sample in pixel _p_
        if (sampleStride > 1) {
            Point2i pm(Mod(p[0], MaxHaltonResolution), Mod(p[1], MaxHaltonResolution));
            for (int i = 0; i < 2; ++i) {
                uint64_t dimOffset =
                    (i == 0) ? InverseRadicalInverse(pm[i], 2, baseExponents[i])
                             : InverseRadicalInverse(pm[i], 3, baseExponents[i]);
                haltonIndex +=
                    dimOffset * (sampleStride / baseScales[i]) * multInverse[i];
            }
            haltonIndex %= sampleStride;
        }

        haltonIndex += sampleIndex * sampleStride;
        dimension = std::max(2, dim);
    }